

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forward16.c
# Opt level: O1

void intobuckets(group_conflict g,bucket_conflict *b,int *used1,int *used2,int pos)

{
  byte bVar1;
  bool bVar2;
  list plVar3;
  group_conflict pgVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  list_conflict tail;
  list_conflict tail_00;
  uint uVar8;
  uint uVar9;
  long lVar10;
  group g_00;
  
  lVar6 = 0;
  do {
    used1[lVar6] = 0;
    *(undefined4 *)((long)b + lVar6 * 4) = 0;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x100);
  resetmem(bucketmem);
  g_00 = g->nextunf;
  if (g_00 != (group)0x0) {
    lVar6 = (long)(int)used2;
    do {
      if (g_00->finis == 0) {
        tail_00 = g_00->head;
        bVar1 = tail_00->str[lVar6];
        if (bVar1 == 0) {
          uVar9 = 0;
        }
        else {
          uVar9 = (uint)tail_00->str[lVar6 + 1];
        }
        uVar9 = (uint)bVar1 << 8 | uVar9;
        if (tail_00->next == (list)0x0) {
          iVar5 = 1;
          bVar2 = true;
        }
        else {
          bVar2 = false;
          iVar5 = 1;
          tail = tail_00;
          plVar3 = tail_00->next;
          do {
            tail_00 = plVar3;
            bVar1 = tail_00->str[lVar6];
            uVar8 = 0;
            if (bVar1 != 0) {
              uVar8 = (uint)tail_00->str[lVar6 + 1];
            }
            uVar8 = (uint)bVar1 << 8 | uVar8;
            if (uVar8 == uVar9) {
              iVar5 = iVar5 + 1;
            }
            else {
              intobucket((bucket_conflict *)(forward2_b + (ulong)uVar9 * 8),g_00->head,tail,iVar5,
                         g_00);
              g_00->head = tail_00;
              bVar2 = true;
              used1[uVar9 & 0xff] = 1;
              *(undefined4 *)((long)b + (ulong)(uVar9 >> 8) * 4) = 1;
              iVar5 = 1;
              uVar9 = uVar8;
            }
            tail = tail_00;
            plVar3 = tail_00->next;
          } while (tail_00->next != (list)0x0);
          bVar2 = !bVar2;
        }
        pgVar4 = g_00;
        if (bVar2) {
          if ((char)uVar9 == '\0') goto LAB_001d8372;
        }
        else {
          intobucket((bucket_conflict *)(forward2_b + (ulong)uVar9 * 8),g_00->head,tail_00,iVar5,
                     g_00);
          g_00->head = (list_conflict)0x0;
          used1[uVar9 & 0xff] = 1;
          *(undefined4 *)((long)b + (ulong)(uVar9 >> 8) * 4) = 1;
        }
      }
      else {
LAB_001d8372:
        g->nextunf = g_00->nextunf;
        pgVar4 = g;
      }
      g_00 = g_00->nextunf;
      g = pgVar4;
    } while (g_00 != (group)0x0);
  }
  lVar6 = 0;
  iVar5 = 0;
  iVar7 = 0;
  do {
    if (*(int *)((long)b + lVar6 * 4) != 0) {
      lVar10 = (long)iVar7;
      iVar7 = iVar7 + 1;
      *(int *)((long)b + lVar10 * 4) = (int)lVar6;
    }
    if (used1[lVar6] != 0) {
      lVar10 = (long)iVar5;
      iVar5 = iVar5 + 1;
      used1[lVar10] = (int)lVar6;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x100);
  *(int *)(b + 0x80) = iVar7;
  used1[0x100] = iVar5;
  return;
}

Assistant:

static void intobuckets(group g, bucket b[], 
                        int *used1, int *used2, int pos)
{
   group prevg;
   character ch, prevch;
   boolean split;
   list tail, tailn;
   int size;
   character buckets1, buckets2;

   for (ch = 0; ch < CHARS; ch++)
      used1[ch] = used2[ch] = FALSE;
   resetmem(bucketmem);
   for (prevg = g, g = g->nextunf ; g; g = g->nextunf) {
      if (g->finis)
         {prevg->nextunf = g->nextunf; continue;}
      tail = g->head; split = FALSE;
      prevch = SHORT(tail->str, pos); size = 1;
      for ( ; (tailn = tail->next); tail = tailn) {
         ch = SHORT(tailn->str, pos); size++;
         if (ch == prevch) continue;
         intobucket(b+prevch, g->head, tail, size-1, g);
         g->head = tailn; split = TRUE;
         used1[HIGH(prevch)] = used2[LOW(prevch)] = TRUE;
         prevch = ch; size = 1;
      }
      if (split) {
         intobucket(b+prevch, g->head, tail, size, g);
         g->head = NULL;
         used1[HIGH(prevch)] = used2[LOW(prevch)] = TRUE;
         prevg = g;
      } else if (IS_ENDMARK(prevch))
         prevg->nextunf = g->nextunf;
      else
         prevg = g;
   }
   buckets1 = buckets2 = 0;
   for (ch = 0; ch < CHARS; ch++) {
      if (used1[ch]) used1[buckets1++] = ch;
      if (used2[ch]) used2[buckets2++] = ch;
   }
   used1[CHARS] = buckets1; used2[CHARS] = buckets2;
/* printf("#buckets: %i\n", bucketp-bucketbase); */
}